

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffinit(fitsfile **fptr,char *name,int *status)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  int local_8d4;
  uint local_8d0;
  int local_8cc;
  int create_disk_file;
  int handle;
  char compspec [80];
  char tmplfile [1025];
  char local_468 [8];
  char outfile [1025];
  char local_58 [8];
  char urltype [20];
  char *url;
  int clobber;
  int slen;
  int driver;
  int ii;
  int *status_local;
  char *name_local;
  fitsfile **fptr_local;
  
  bVar4 = false;
  *fptr = (fitsfile *)0x0;
  if (*status < 1) {
    iVar1 = *status;
    if (iVar1 == -0x6a) {
      *status = 0;
    }
    local_8d0 = (uint)(iVar1 == -0x6a);
    _driver = status;
    status_local = (int *)name;
    name_local = (char *)fptr;
    if (need_to_initialize != 0) {
      iVar1 = fits_init_cfitsio();
      *_driver = iVar1;
    }
    if (*_driver < 1) {
      for (stack0xffffffffffffffc0 = status_local; (char)*stack0xffffffffffffffc0 == ' ';
          register0x00000000 = (int *)((long)stack0xffffffffffffffc0 + 1)) {
      }
      if ((char)*stack0xffffffffffffffc0 == '\0') {
        ffpmsg("Name of file to create is blank. (ffinit)");
        *_driver = 0x69;
        fptr_local._4_4_ = 0x69;
      }
      else {
        if (local_8d0 == 0) {
          bVar4 = (char)*stack0xffffffffffffffc0 == '!';
          if (bVar4) {
            register0x00000000 = (int *)((long)stack0xffffffffffffffc0 + 1);
          }
          ffourl((char *)stack0xffffffffffffffc0,local_58,local_468,compspec + 0x48,
                 (char *)&create_disk_file,_driver);
          if (0 < *_driver) {
            ffpmsg("could not parse the output filename: (ffinit)");
            ffpmsg((char *)stack0xffffffffffffffc0);
            return *_driver;
          }
        }
        else {
          sVar2 = strlen((char *)stack0xffffffffffffffc0);
          if (0x400 < sVar2) {
            ffpmsg("Filename is too long. (ffinit)");
            *_driver = 0x69;
            return 0x69;
          }
          strcpy(local_468,(char *)stack0xffffffffffffffc0);
          strcpy(local_58,"file://");
          compspec[0x48] = '\0';
          create_disk_file._0_1_ = '\0';
        }
        iVar1 = urltype2driver(local_58,&clobber);
        *_driver = iVar1;
        if (*_driver == 0) {
          if ((bVar4) && (driverTable[clobber].remove != (_func_int_char_ptr *)0x0)) {
            (*driverTable[clobber].remove)(local_468);
          }
          if (driverTable[clobber].create == (_func_int_char_ptr_int_ptr *)0x0) {
            ffpmsg("cannot create a new file of this type: (ffinit)");
            ffpmsg((char *)stack0xffffffffffffffc0);
            *_driver = 0x69;
            fptr_local._4_4_ = 0x69;
          }
          else {
            iVar1 = (*driverTable[clobber].create)(local_468,&local_8cc);
            *_driver = iVar1;
            if (*_driver == 0) {
              pvVar3 = calloc(1,0x10);
              *(void **)name_local = pvVar3;
              if (*(long *)name_local == 0) {
                (*driverTable[clobber].close)(local_8cc);
                ffpmsg("failed to allocate structure for following file: (ffopen)");
                ffpmsg((char *)stack0xffffffffffffffc0);
                *_driver = 0x71;
                fptr_local._4_4_ = 0x71;
              }
              else {
                pvVar3 = calloc(1,0x7e8);
                *(void **)(*(long *)name_local + 8) = pvVar3;
                if (*(long *)(*(long *)name_local + 8) == 0) {
                  (*driverTable[clobber].close)(local_8cc);
                  ffpmsg("failed to allocate structure for following file: (ffopen)");
                  ffpmsg((char *)stack0xffffffffffffffc0);
                  free(*(void **)name_local);
                  name_local[0] = '\0';
                  name_local[1] = '\0';
                  name_local[2] = '\0';
                  name_local[3] = '\0';
                  name_local[4] = '\0';
                  name_local[5] = '\0';
                  name_local[6] = '\0';
                  name_local[7] = '\0';
                  *_driver = 0x71;
                  fptr_local._4_4_ = 0x71;
                }
                else {
                  sVar2 = strlen((char *)stack0xffffffffffffffc0);
                  local_8d4 = (int)sVar2 + 1;
                  if (local_8d4 < 0x21) {
                    local_8d4 = 0x20;
                  }
                  pvVar3 = malloc((long)local_8d4);
                  *(void **)(*(long *)(*(long *)name_local + 8) + 0x10) = pvVar3;
                  if (*(long *)(*(long *)(*(long *)name_local + 8) + 0x10) == 0) {
                    (*driverTable[clobber].close)(local_8cc);
                    ffpmsg("failed to allocate memory for filename: (ffinit)");
                    ffpmsg((char *)stack0xffffffffffffffc0);
                    free(*(void **)(*(long *)name_local + 8));
                    free(*(void **)name_local);
                    name_local[0] = '\0';
                    name_local[1] = '\0';
                    name_local[2] = '\0';
                    name_local[3] = '\0';
                    name_local[4] = '\0';
                    name_local[5] = '\0';
                    name_local[6] = '\0';
                    name_local[7] = '\0';
                    *_driver = 0x69;
                    fptr_local._4_4_ = 0x69;
                  }
                  else {
                    pvVar3 = calloc(0x3e9,8);
                    *(void **)(*(long *)(*(long *)name_local + 8) + 0x68) = pvVar3;
                    if (*(long *)(*(long *)(*(long *)name_local + 8) + 0x68) == 0) {
                      (*driverTable[clobber].close)(local_8cc);
                      ffpmsg("failed to allocate memory for headstart array: (ffinit)");
                      ffpmsg((char *)stack0xffffffffffffffc0);
                      free(*(void **)(*(long *)(*(long *)name_local + 8) + 0x10));
                      free(*(void **)(*(long *)name_local + 8));
                      free(*(void **)name_local);
                      name_local[0] = '\0';
                      name_local[1] = '\0';
                      name_local[2] = '\0';
                      name_local[3] = '\0';
                      name_local[4] = '\0';
                      name_local[5] = '\0';
                      name_local[6] = '\0';
                      name_local[7] = '\0';
                      *_driver = 0x71;
                      fptr_local._4_4_ = 0x71;
                    }
                    else {
                      pvVar3 = calloc(0x28,0xb40);
                      *(void **)(*(long *)(*(long *)name_local + 8) + 0x560) = pvVar3;
                      if (*(long *)(*(long *)(*(long *)name_local + 8) + 0x560) == 0) {
                        (*driverTable[clobber].close)(local_8cc);
                        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
                        ffpmsg((char *)stack0xffffffffffffffc0);
                        free(*(void **)(*(long *)(*(long *)name_local + 8) + 0x68));
                        free(*(void **)(*(long *)(*(long *)name_local + 8) + 0x10));
                        free(*(void **)(*(long *)name_local + 8));
                        free(*(void **)name_local);
                        name_local[0] = '\0';
                        name_local[1] = '\0';
                        name_local[2] = '\0';
                        name_local[3] = '\0';
                        name_local[4] = '\0';
                        name_local[5] = '\0';
                        name_local[6] = '\0';
                        name_local[7] = '\0';
                        *_driver = 0x71;
                        fptr_local._4_4_ = 0x71;
                      }
                      else {
                        for (slen = 0; slen < 0x28; slen = slen + 1) {
                          *(int *)(*(long *)(*(long *)name_local + 8) + 0x748 + (long)slen * 4) =
                               slen;
                          *(undefined8 *)
                           (*(long *)(*(long *)name_local + 8) + 0x568 + (long)slen * 8) =
                               0xffffffffffffffff;
                        }
                        *(undefined4 *)(*(long *)(*(long *)name_local + 8) + 100) = 1000;
                        **(int **)(*(long *)name_local + 8) = local_8cc;
                        *(int *)(*(long *)(*(long *)name_local + 8) + 4) = clobber;
                        strcpy(*(char **)(*(long *)(*(long *)name_local + 8) + 0x10),
                               (char *)stack0xffffffffffffffc0);
                        *(undefined8 *)(*(long *)(*(long *)name_local + 8) + 0x28) = 0;
                        *(undefined8 *)(*(long *)(*(long *)name_local + 8) + 0x30) = 0;
                        *(undefined4 *)(*(long *)(*(long *)name_local + 8) + 0x5c) = 1;
                        *(undefined8 *)(*(long *)(*(long *)name_local + 8) + 0x88) =
                             0xffffffffffffffff;
                        *(undefined4 *)(*(long *)(*(long *)name_local + 8) + 0x50) = 0xffffffff;
                        *(undefined4 *)(*(long *)(*(long *)name_local + 8) + 8) = 1;
                        *(undefined4 *)(*(long *)(*(long *)name_local + 8) + 0x18) = 0x22b;
                        *(uint *)(*(long *)(*(long *)name_local + 8) + 0x20) = local_8d0;
                        ffldrc(*(fitsfile **)name_local,0,1,_driver);
                        fits_store_Fptr(*(FITSfile **)(*(long *)name_local + 8),_driver);
                        if (compspec[0x48] != '\0') {
                          ffoptplt(*(fitsfile **)name_local,compspec + 0x48,_driver);
                        }
                        if ((char)create_disk_file != '\0') {
                          ffparsecompspec(*(fitsfile **)name_local,(char *)&create_disk_file,_driver
                                         );
                        }
                        fptr_local._4_4_ = *_driver;
                      }
                    }
                  }
                }
              }
            }
            else {
              ffpmsg("failed to create new file (already exists?):");
              ffpmsg((char *)stack0xffffffffffffffc0);
              fptr_local._4_4_ = *_driver;
            }
          }
        }
        else {
          ffpmsg("could not find driver for this file: (ffinit)");
          ffpmsg((char *)stack0xffffffffffffffc0);
          fptr_local._4_4_ = *_driver;
        }
      }
    }
    else {
      fptr_local._4_4_ = *_driver;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file.
*/
{
    int ii, driver, slen, clobber = 0;
    char *url;
    char urltype[MAX_PREFIX_LEN], outfile[FLEN_FILENAME];
    char tmplfile[FLEN_FILENAME], compspec[80];
    int handle, create_disk_file = 0;

    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if (*status == CREATE_DISK_FILE)
    {
       create_disk_file = 1;
       *status = 0;
    }

    if (need_to_initialize)  {          /* this is called only once */
        *status = fits_init_cfitsio();
    }

    if (*status > 0)
        return(*status);

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the filename */
        url++;

    if (*url == '\0')
    {
        ffpmsg("Name of file to create is blank. (ffinit)");
        return(*status = FILE_NOT_CREATED);
    }

    if (create_disk_file)
    {
       if (strlen(url) > FLEN_FILENAME - 1)
       {
           ffpmsg("Filename is too long. (ffinit)");
           return(*status = FILE_NOT_CREATED);
       }

       strcpy(outfile, url);
       strcpy(urltype, "file://");
       tmplfile[0] = '\0';
       compspec[0] = '\0';
    }
    else
    {
       
      /* check for clobber symbol, i.e,  overwrite existing file */
      if (*url == '!')
      {
          clobber = TRUE;
          url++;
      }
      else
          clobber = FALSE;

        /* parse the output file specification */
	/* this routine checks that the strings will not overflow */
      ffourl(url, urltype, outfile, tmplfile, compspec, status);

      if (*status > 0)
      {
        ffpmsg("could not parse the output filename: (ffinit)");
        ffpmsg(url);
        return(*status);
      }
    }
    
        /* find which driver corresponds to the urltype */
    *status = urltype2driver(urltype, &driver);

    if (*status)
    {
        ffpmsg("could not find driver for this file: (ffinit)");
        ffpmsg(url);
        return(*status);
    }

        /* delete pre-existing file, if asked to do so */
    if (clobber)
    {
        if (driverTable[driver].remove)
             (*driverTable[driver].remove)(outfile);
    }

        /* call appropriate driver to create the file */
    if (driverTable[driver].create)
    {

        FFLOCK;  /* lock this while searching for vacant handle */
        *status = (*driverTable[driver].create)(outfile, &handle);
        FFUNLOCK;

        if (*status)
        {
            ffpmsg("failed to create new file (already exists?):");
            ffpmsg(url);
            return(*status);
       }
    }
    else
    {
        ffpmsg("cannot create a new file of this type: (ffinit)");
        ffpmsg(url);
        return(*status = FILE_NOT_CREATED);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffinit)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = FILE_NOT_CREATED);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* store the file pointer */
    ((*fptr)->Fptr)->driver = driver;            /*  driver number         */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename    */
    ((*fptr)->Fptr)->filesize = 0;               /* physical file size     */
    ((*fptr)->Fptr)->logfilesize = 0;            /* logical file size      */
    ((*fptr)->Fptr)->writemode = 1;              /* read-write mode        */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data  */
    ((*fptr)->Fptr)->curbuf = -1;         /* undefined current IO buffer   */
    ((*fptr)->Fptr)->open_count = 1;      /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = create_disk_file; /* true if extended syntax is disabled */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    /* if template file was given, use it to define structure of new file */

    if (tmplfile[0])
        ffoptplt(*fptr, tmplfile, status);

    /* parse and save image compression specification, if given */
    if (compspec[0])
        ffparsecompspec(*fptr, compspec, status);

    return(*status);                       /* successful return */
}